

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O3

void __thiscall imrt::Station::initializeStation(Station *this,int type,int open_apertures)

{
  pointer pdVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  pair<int,_int> pVar7;
  int j_1;
  uint uVar8;
  int j;
  int iVar9;
  int j_3;
  long lVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  long lVar16;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> aux;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_58;
  pair<int,_int> local_40;
  uint local_34;
  
  uVar8 = type;
  if ((uint)type < 2) {
    uVar6 = (ulong)(uint)this->max_apertures;
    if (0 < this->max_apertures) {
      lVar10 = 0;
      do {
        local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pair<int,_int> *)0x0;
        local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pair<int,_int> *)0x0;
        for (iVar9 = 0; iVar3 = Collimator::getXdim(this->collimator), iVar9 < iVar3;
            iVar9 = iVar9 + 1) {
          local_40 = Collimator::getActiveRange(this->collimator,iVar9,this->angle);
          if (local_58.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish ==
              local_58.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            _M_realloc_insert<std::pair<int,int>>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                       (iterator)
                       local_58.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_40);
          }
          else {
            *local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish = local_40;
            local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_58.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
                  ((this->A).
                   super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar10,&local_58);
        if (local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        lVar10 = lVar10 + 1;
        uVar6 = (ulong)this->max_apertures;
      } while (lVar10 < (long)uVar6);
    }
LAB_00114335:
    auVar2 = _DAT_00123b00;
    uVar5 = (uint)uVar6;
    if ((uVar8 & 0xfffffffd) == 0) {
      if (0 < (int)uVar5) {
        iVar9 = this->min_intensity;
        pdVar1 = (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar10 = (uVar6 & 0xffffffff) - 1;
        auVar13._8_4_ = (int)lVar10;
        auVar13._0_8_ = lVar10;
        auVar13._12_4_ = (int)((ulong)lVar10 >> 0x20);
        lVar10 = 0;
        auVar13 = auVar13 ^ _DAT_00123b00;
        auVar17 = _DAT_00123af0;
        do {
          auVar18 = auVar17 ^ auVar2;
          if ((bool)(~(auVar18._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar18._0_4_ ||
                      auVar13._4_4_ < auVar18._4_4_) & 1)) {
            *(double *)((long)pdVar1 + lVar10) = (double)iVar9;
          }
          if ((auVar18._12_4_ != auVar13._12_4_ || auVar18._8_4_ <= auVar13._8_4_) &&
              auVar18._12_4_ <= auVar13._12_4_) {
            *(double *)((long)pdVar1 + lVar10 + 8) = (double)iVar9;
          }
          lVar16 = auVar17._8_8_;
          auVar17._0_8_ = auVar17._0_8_ + 2;
          auVar17._8_8_ = lVar16 + 2;
          lVar10 = lVar10 + 0x10;
        } while ((ulong)(uVar5 + 1 >> 1) << 4 != lVar10);
      }
      goto LAB_00114624;
    }
    if ((uVar8 & 0xfffffffd) == 1) {
      if (0 < (int)uVar5) {
        iVar9 = this->max_intensity;
        pdVar1 = (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar10 = (uVar6 & 0xffffffff) - 1;
        auVar12._8_4_ = (int)lVar10;
        auVar12._0_8_ = lVar10;
        auVar12._12_4_ = (int)((ulong)lVar10 >> 0x20);
        lVar10 = 0;
        auVar12 = auVar12 ^ _DAT_00123b00;
        auVar18 = _DAT_00123af0;
        do {
          auVar17 = auVar18 ^ auVar2;
          if ((bool)(~(auVar17._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar17._0_4_ ||
                      auVar12._4_4_ < auVar17._4_4_) & 1)) {
            *(double *)((long)pdVar1 + lVar10) = (double)iVar9;
          }
          if ((auVar17._12_4_ != auVar12._12_4_ || auVar17._8_4_ <= auVar12._8_4_) &&
              auVar17._12_4_ <= auVar12._12_4_) {
            *(double *)((long)pdVar1 + lVar10 + 8) = (double)iVar9;
          }
          lVar16 = auVar18._8_8_;
          auVar18._0_8_ = auVar18._0_8_ + 2;
          auVar18._8_8_ = lVar16 + 2;
          lVar10 = lVar10 + 0x10;
        } while ((ulong)(uVar5 + 1 >> 1) << 4 != lVar10);
      }
      goto LAB_00114624;
    }
    if (uVar8 != 4) {
      if (0 < (int)uVar5) {
        iVar9 = this->initial_intensity;
        pdVar1 = (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar10 = (uVar6 & 0xffffffff) - 1;
        auVar14._8_4_ = (int)lVar10;
        auVar14._0_8_ = lVar10;
        auVar14._12_4_ = (int)((ulong)lVar10 >> 0x20);
        lVar10 = 0;
        auVar14 = auVar14 ^ _DAT_00123b00;
        auVar15 = _DAT_00123af0;
        do {
          auVar17 = auVar15 ^ auVar2;
          if ((bool)(~(auVar17._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar17._0_4_ ||
                      auVar14._4_4_ < auVar17._4_4_) & 1)) {
            *(double *)((long)pdVar1 + lVar10) = (double)iVar9;
          }
          if ((auVar17._12_4_ != auVar14._12_4_ || auVar17._8_4_ <= auVar14._8_4_) &&
              auVar17._12_4_ <= auVar14._12_4_) {
            *(double *)((long)pdVar1 + lVar10 + 8) = (double)iVar9;
          }
          lVar16 = auVar15._8_8_;
          auVar15._0_8_ = auVar15._0_8_ + 2;
          auVar15._8_8_ = lVar16 + 2;
          lVar10 = lVar10 + 0x10;
        } while ((ulong)(uVar5 + 1 >> 1) << 4 != lVar10);
      }
      goto LAB_00114624;
    }
  }
  else {
    if ((type & 0xfffffffeU) == 2) {
      uVar6 = (ulong)(uint)this->max_apertures;
      if (0 < this->max_apertures) {
        lVar10 = 0;
        do {
          local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pair<int,_int> *)0x0;
          local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pair<int,_int> *)0x0;
          for (iVar9 = 0; iVar3 = Collimator::getXdim(this->collimator), iVar9 < iVar3;
              iVar9 = iVar9 + 1) {
            local_40.first = -1;
            local_40.second = -1;
            if (local_58.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_58.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              _M_realloc_insert<std::pair<int,int>>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                         (iterator)
                         local_58.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_40);
            }
            else {
              (local_58.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->first = -1;
              (local_58.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->second = -1;
              local_58.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish =
                   local_58.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
                    ((this->A).
                     super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar10,&local_58);
          if (local_58.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_58.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          lVar10 = lVar10 + 1;
          uVar6 = (ulong)this->max_apertures;
        } while (lVar10 < (long)uVar6);
      }
      goto LAB_00114335;
    }
    uVar5 = this->max_apertures;
    uVar6 = (ulong)uVar5;
    if (type != 4) {
      if (0 < (int)uVar5) {
        lVar10 = 0;
        local_34 = type;
        do {
          local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pair<int,_int> *)0x0;
          local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pair<int,_int> *)0x0;
          for (iVar9 = 0; iVar3 = Collimator::getXdim(this->collimator), iVar9 < iVar3;
              iVar9 = iVar9 + 1) {
            if (open_apertures < 1) {
              local_40.first = -1;
              local_40.second = -1;
              if (local_58.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  local_58.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                (local_58.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->first = -1;
                (local_58.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->second = -1;
                goto LAB_001142d0;
              }
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              _M_realloc_insert<std::pair<int,int>>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                         (iterator)
                         local_58.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_40);
            }
            else {
              local_40 = Collimator::getActiveRange(this->collimator,iVar9,this->angle);
              if (local_58.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_58.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                _M_realloc_insert<std::pair<int,int>>
                          ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                           &local_58,
                           (iterator)
                           local_58.
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_40);
              }
              else {
                *local_58.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish = local_40;
LAB_001142d0:
                local_58.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_58.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
          }
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
                    ((this->A).
                     super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar10,&local_58);
          if (local_58.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_58.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          open_apertures = open_apertures + -1;
          lVar10 = lVar10 + 1;
          uVar6 = (ulong)this->max_apertures;
          uVar8 = local_34;
        } while (lVar10 < (long)uVar6);
      }
      goto LAB_00114335;
    }
    uVar8 = 4;
    if (0 < (int)uVar5) {
      lVar10 = 0;
      local_34 = type;
      do {
        local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pair<int,_int> *)0x0;
        local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pair<int,_int> *)0x0;
        for (iVar9 = 0; iVar3 = Collimator::getXdim(this->collimator), iVar9 < iVar3;
            iVar9 = iVar9 + 1) {
          pVar7 = Collimator::getActiveRange(this->collimator,iVar9,this->angle);
          iVar3 = pVar7.first;
          if (iVar3 < 0) {
            local_40.first = -1;
            local_40.second = -1;
            if (local_58.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                local_58.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              (local_58.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->first = -1;
              (local_58.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->second = -1;
              goto LAB_001141d6;
            }
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            _M_realloc_insert<std::pair<int,int>>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                       (iterator)
                       local_58.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_40);
          }
          else {
            iVar4 = rand();
            iVar11 = pVar7.second;
            iVar3 = iVar4 % ((iVar11 - iVar3) + 1) + iVar3;
            if (iVar3 == iVar11) {
              local_40 = (pair<int,_int>)((ulong)pVar7 & 0xffffffff00000000 | (ulong)pVar7 >> 0x20);
              if (local_58.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_58.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                _M_realloc_insert<std::pair<int,int>>
                          ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                           &local_58,
                           (iterator)
                           local_58.
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_40);
              }
              else {
                *local_58.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish = local_40;
LAB_001141d6:
                local_58.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_58.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            else {
              iVar4 = rand();
              local_40.second = iVar4 % ((iVar11 - iVar3) + 1) + iVar3;
              local_40.first = iVar3;
              if (local_58.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  local_58.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                *local_58.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish = local_40;
                goto LAB_001141d6;
              }
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              _M_realloc_insert<std::pair<int,int>>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                         (iterator)
                         local_58.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_40);
            }
          }
        }
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
                  ((this->A).
                   super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar10,&local_58);
        if (local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        lVar10 = lVar10 + 1;
        uVar6 = (ulong)this->max_apertures;
        uVar8 = local_34;
      } while (lVar10 < (long)uVar6);
      goto LAB_00114335;
    }
  }
  local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pair<int,_int> *)0x0;
  local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pair<int,_int> *)0x0;
  local_40 = (pair<int,_int>)((ulong)local_40 & 0xffffffff00000000);
  if (-1 < this->max_intensity) {
    iVar9 = 0;
    do {
      if (local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_58,
                   (iterator)
                   local_58.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_40.first);
      }
      else {
        (local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
         _M_impl.super__Vector_impl_data._M_finish)->first = iVar9;
        local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)local_58.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 4);
      }
      iVar9 = this->step_intensity + local_40.first;
      local_40.first = iVar9;
    } while (iVar9 <= this->max_intensity);
    uVar5 = this->max_apertures;
  }
  if ((int)uVar5 < 1) {
    if (local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_00114624;
  }
  else {
    lVar10 = 0;
    do {
      iVar9 = rand();
      (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar10] =
           (double)(&(local_58.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->first)
                   [(int)((ulong)(long)iVar9 %
                         (((long)local_58.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_58.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 2) + 1U))];
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->max_apertures);
  }
  operator_delete(local_58.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start);
LAB_00114624:
  if (uVar8 == 5) {
    generate_random_intensities(this);
  }
  else {
    generateIntensity(this);
  }
  return;
}

Assistant:

void Station::initializeStation(int type, int open_apertures) {
    // Generating aperture patterns


    if (type==OPEN_MAX_SETUP || type==OPEN_MIN_SETUP) {
      for (int i=0; i<max_apertures; i++) {
        vector<pair<int,int> > aux;
        for (int j=0; j<collimator.getXdim(); j++){
          aux.push_back(collimator.getActiveRange(j,angle));
        }
	      A[i] =aux;
      }
    } else if (type==CLOSED_MAX_SETUP || type==CLOSED_MIN_SETUP) {
      for (int i=0; i<max_apertures; i++){
        vector<pair<int,int> > aux;
        for (int j=0; j<collimator.getXdim(); j++)
          aux.push_back(make_pair(-1,-1));
        A[i] = aux;
      }
    } else if (type==RAND_RAND_SETUP) {
      for (int i=0; i<max_apertures; i++) {
        vector<pair<int,int> > aux;
        for (int j=0; j<collimator.getXdim(); j++) {
          pair<int, int> range = collimator.getActiveRange(j,angle);
          if (range.first<0) {
            aux.push_back(make_pair(-1,-1));
            continue;
          }
          int index1 = range.first + rand() % (range.second-range.first+1);
          if (index1 == range.second) {
            aux.push_back(make_pair(range.second,range.second));
          } else {
            int index2 = index1 + rand() % (range.second-index1+1);
            aux.push_back(make_pair(index1,index2));
          }
        }
        A[i]=aux;
      }
    } else {
      //Keeping this for backwards compatibility
      for (int i=0; i<max_apertures; i++) {
        vector<pair<int,int> > aux;
        for (int j=0; j<collimator.getXdim(); j++) {
          if (open_apertures>0)
            aux.push_back(collimator.getActiveRange(j,angle));
          else
            aux.push_back(make_pair(-1,-1));
        }
        open_apertures--;
        A[i]=aux;
      }
    }

    // Generating intensity
    if (type==OPEN_MIN_SETUP || type==CLOSED_MIN_SETUP) {
      for (int i=0; i<max_apertures; i++)
        intensity[i] = min_intensity;
    } else if (type==OPEN_MAX_SETUP || type==CLOSED_MAX_SETUP) {
      for (int i=0; i<max_apertures; i++)
        intensity[i] = max_intensity;
    } else if (type==RAND_RAND_SETUP) {
      vector<int> levels;
      for (int k=0; k<=max_intensity; k=k+step_intensity)
        levels.push_back(k);
      int sel;
      for (int i=0; i<max_apertures; i++) {
        sel = (rand() %  (levels.size()+1));
        intensity[i] = levels[sel];
      }
    } else {
      for (int i=0; i<max_apertures; i++)
        intensity[i] = initial_intensity;
    }

    if(type==RAND_INTENSITIES)
      generate_random_intensities();
    else
      generateIntensity();
  }